

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty_pty(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = openpty(&master_fd,&slave_fd,0,0,&w);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s\n","No pty available, skipping.");
      fflush(_stderr);
      return 1;
    }
    iVar1 = uv_tty_init(&loop,&slave_tty,slave_fd,0);
    if (iVar1 == 0) {
      iVar1 = uv_tty_init(&loop,&master_tty,master_fd,0);
      if (iVar1 == 0) {
        iVar1 = uv_is_readable((uv_stream_t *)&slave_tty);
        if (iVar1 == 0) {
          pcVar4 = "uv_is_readable((uv_stream_t*) &slave_tty)";
          uVar3 = 0x1bb;
        }
        else {
          iVar1 = uv_is_writable((uv_stream_t *)&slave_tty);
          if (iVar1 == 0) {
            pcVar4 = "uv_is_writable((uv_stream_t*) &slave_tty)";
            uVar3 = 0x1bc;
          }
          else {
            iVar1 = uv_is_readable((uv_stream_t *)&master_tty);
            if (iVar1 == 0) {
              pcVar4 = "uv_is_readable((uv_stream_t*) &master_tty)";
              uVar3 = 0x1bd;
            }
            else {
              iVar1 = uv_is_writable((uv_stream_t *)&master_tty);
              if (iVar1 == 0) {
                pcVar4 = "uv_is_writable((uv_stream_t*) &master_tty)";
                uVar3 = 0x1be;
              }
              else if ((slave_tty.flags._2_1_ & 0x10) == 0) {
                if ((master_tty.flags._2_1_ & 0x10) == 0) {
                  pcVar4 = "master_tty.flags & 0x100000";
                  uVar3 = 0x1c5;
                }
                else {
                  iVar1 = close(slave_fd);
                  if (iVar1 == 0) {
                    uv_close((uv_handle_t *)&slave_tty,(uv_close_cb)0x0);
                    iVar1 = close(master_fd);
                    if (iVar1 == 0) {
                      uv_close((uv_handle_t *)&master_tty,(uv_close_cb)0x0);
                      iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
                      if (iVar1 == 0) {
                        puVar2 = uv_default_loop();
                        close_loop(puVar2);
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                        uVar3 = 0x1cd;
                      }
                      else {
                        pcVar4 = "0 == uv_run(&loop, UV_RUN_DEFAULT)";
                        uVar3 = 0x1cb;
                      }
                    }
                    else {
                      pcVar4 = "0 == close(master_fd)";
                      uVar3 = 0x1c8;
                    }
                  }
                  else {
                    pcVar4 = "0 == close(slave_fd)";
                    uVar3 = 0x1c6;
                  }
                }
              }
              else {
                pcVar4 = "0 == (slave_tty.flags & 0x100000)";
                uVar3 = 0x1c2;
              }
            }
          }
        }
      }
      else {
        pcVar4 = "0 == uv_tty_init(&loop, &master_tty, master_fd, 0)";
        uVar3 = 0x1ba;
      }
    }
    else {
      pcVar4 = "0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0)";
      uVar3 = 0x1b9;
    }
  }
  else {
    pcVar4 = "0 == uv_loop_init(&loop)";
    uVar3 = 0x1b3;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tty_pty) {
#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}